

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_const_array(Context *ctx,ConstantsList *clist,int base,int size)

{
  char *pcVar1;
  uint uVar2;
  int leavedecimal;
  char *buf;
  int iVar3;
  char val0 [32];
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char varname [64];
  char local_f8 [32];
  char local_d8 [32];
  char local_b8 [32];
  char local_98 [32];
  char local_78 [72];
  
  snprintf(local_78,0x40,"const_array_%d_%d",base,(ulong)(uint)size);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"const float4 %s[%d] = {",local_78,(ulong)(uint)size);
  iVar3 = ctx->indent;
  buf = (char *)(ulong)(iVar3 + 1U);
  ctx->indent = iVar3 + 1U;
  if (0 < size) {
    iVar3 = 0;
    do {
      for (; leavedecimal = (int)buf, (clist->constant).type != MOJOSHADER_UNIFORM_FLOAT;
          clist = clist->next) {
      }
      if ((clist->constant).index != base + iVar3) {
        __assert_fail("clist->constant.index == (base + i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x126e,
                      "void emit_METAL_const_array(Context *, const ConstantsList *, int, int)");
      }
      floatstr(ctx,local_f8,1,(clist->constant).value.f[0],leavedecimal);
      buf = local_98;
      floatstr(ctx,buf,1,(clist->constant).value.f[1],leavedecimal);
      floatstr(ctx,local_b8,1,(clist->constant).value.f[2],leavedecimal);
      floatstr(ctx,local_d8,1,(clist->constant).value.f[3],leavedecimal);
      pcVar1 = "\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n";
      if (iVar3 < size + -1) {
        pcVar1 = "texture%s<float> %s_texture [[texture(%d)]],";
      }
      output_line(ctx,"float4(%s, %s, %s, %s)%s",local_f8,buf,local_b8,local_d8,pcVar1 + 0x2b);
      clist = clist->next;
      iVar3 = iVar3 + 1;
    } while (iVar3 != size);
    iVar3 = ctx->indent + -1;
  }
  ctx->indent = iVar3;
  output_line(ctx,"};");
  output_line(ctx,"(void) %s[0];",local_78);
  if (0 < ctx->output_stack_len) {
    uVar2 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar2;
    ctx->output = ctx->output_stack[uVar2];
    ctx->indent = ctx->indent_stack[uVar2];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_METAL_const_array(Context *ctx, const ConstantsList *clist,
                                   int base, int size)
{
    char varname[64];
    get_METAL_const_array_varname_in_buf(ctx,base,size,varname,sizeof(varname));

    const char *cstr = NULL;
    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;
    output_line(ctx, "const float4 %s[%d] = {", varname, size);
    ctx->indent++;

    int i;
    for (i = 0; i < size; i++)
    {
        while (clist->constant.type != MOJOSHADER_UNIFORM_FLOAT)
            clist = clist->next;
        assert(clist->constant.index == (base + i));

        char val0[32];
        char val1[32];
        char val2[32];
        char val3[32];
        floatstr(ctx, val0, sizeof (val0), clist->constant.value.f[0], 1);
        floatstr(ctx, val1, sizeof (val1), clist->constant.value.f[1], 1);
        floatstr(ctx, val2, sizeof (val2), clist->constant.value.f[2], 1);
        floatstr(ctx, val3, sizeof (val3), clist->constant.value.f[3], 1);

        output_line(ctx, "float4(%s, %s, %s, %s)%s", val0, val1, val2, val3,
                        (i < (size-1)) ? "," : "");

        clist = clist->next;
    } // for

    ctx->indent--;
    output_line(ctx, "};");
    output_line(ctx, "(void) %s[0];", varname);  // stop compiler warnings.
    pop_output(ctx);
}